

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::isConversionAllowed(TIntermediate *this,TOperator op,TIntermTyped *node)

{
  int iVar1;
  EShSource EVar2;
  TOperator TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *node_local;
  TOperator op_local;
  TIntermediate *this_local;
  
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  if (iVar1 == 0) {
    return false;
  }
  if ((((iVar1 - 0xdU < 2) || (iVar1 == 0x11)) && (op != EOpFunction)) &&
     ((EVar2 = getSource(this), EVar2 != EShSourceHlsl ||
      (iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar1 != 0xe)))) {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if ((iVar1 == 0xe) &&
       ((op == EOpAssign &&
        (iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])(),
        CONCAT44(extraout_var,iVar1) != 0)))) {
      iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])();
      TVar3 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_00,iVar1));
      if (TVar3 == EOpConstructTextureSampler) goto LAB_0073a00b;
    }
    this_local._7_1_ = false;
  }
  else {
LAB_0073a00b:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::isConversionAllowed(TOperator op, TIntermTyped* node) const
{
    //
    // Does the base type even allow the operation?
    //
    switch (node->getBasicType()) {
    case EbtVoid:
        return false;
    case EbtAtomicUint:
    case EbtSampler:
    case EbtAccStruct:
        // opaque types can be passed to functions
        if (op == EOpFunction)
            break;

        // HLSL can assign samplers directly (no constructor)
        if (getSource() == EShSourceHlsl && node->getBasicType() == EbtSampler)
            break;

        // samplers can get assigned via a sampler constructor
        // (well, not yet, but code in the rest of this function is ready for it)
        if (node->getBasicType() == EbtSampler && op == EOpAssign &&
            node->getAsOperator() != nullptr && node->getAsOperator()->getOp() == EOpConstructTextureSampler)
            break;

        // otherwise, opaque types can't even be operated on, let alone converted
        return false;
    default:
        break;
    }

    return true;
}